

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O0

void __thiscall spvtools::opt::Instruction::ClearDbgLineInsts(Instruction *this)

{
  bool bVar1;
  IRContext *pIVar2;
  DefUseManager *this_00;
  reference inst;
  Instruction *l_inst;
  iterator __end3;
  iterator __begin3;
  vector<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_> *__range3;
  DefUseManager *def_use_mgr;
  Instruction *this_local;
  
  pIVar2 = context(this);
  bVar1 = IRContext::AreAnalysesValid(pIVar2,kAnalysisBegin);
  if (bVar1) {
    pIVar2 = context(this);
    this_00 = IRContext::get_def_use_mgr(pIVar2);
    __end3 = std::vector<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>::
             begin(&this->dbg_line_insts_);
    l_inst = (Instruction *)
             std::vector<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>::
             end(&this->dbg_line_insts_);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<spvtools::opt::Instruction_*,_std::vector<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>_>
                                       *)&l_inst), bVar1) {
      inst = __gnu_cxx::
             __normal_iterator<spvtools::opt::Instruction_*,_std::vector<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>_>
             ::operator*(&__end3);
      analysis::DefUseManager::ClearInst(this_00,inst);
      __gnu_cxx::
      __normal_iterator<spvtools::opt::Instruction_*,_std::vector<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>_>
      ::operator++(&__end3);
    }
  }
  clear_dbg_line_insts(this);
  return;
}

Assistant:

void Instruction::ClearDbgLineInsts() {
  if (context()->AreAnalysesValid(IRContext::kAnalysisDefUse)) {
    auto def_use_mgr = context()->get_def_use_mgr();
    for (auto& l_inst : dbg_line_insts_) def_use_mgr->ClearInst(&l_inst);
  }
  clear_dbg_line_insts();
}